

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Underwater_Acoustic_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  pointer pAVar3;
  pointer pUVar4;
  KString *pKVar5;
  ostream *poVar6;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  pointer pSVar7;
  pointer pAVar8;
  pointer pUVar9;
  KStringStream ss;
  KString local_2c0;
  KString *local_2a0;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2c0,&this->super_Header);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-Underwater Acoustic PDU-\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Emitting Entity ID:\n",0x14);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_218,&local_1d8,Tabs,in_CL);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EventID);
  UTILS::IndentString(&local_238,&local_1f8,Tabs_00,in_CL);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"State Update Indicator:  ",0x19);
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            (&local_258,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Passive Parameter Index: ",0x19);
  DATA_TYPE::ENUMS::GetEnumAsStringPassiveParameterIndex_abi_cxx11_
            (&local_278,(ENUMS *)(ulong)this->m_ui16PassiveParamIndex,Value_00);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Prop Plant Config:       ",0x19);
  DATA_TYPE::ENUMS::GetEnumAsStringPropulsionPlantConfiguration_abi_cxx11_
            (&local_298,(ENUMS *)(ulong)this->m_ui8PropPlantConfig,Value_01);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Number Of Shafts:        ",0x19);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Number Of APA:           ",0x19);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Number Of UAES:          ",0x19);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_2c0.field_2;
  local_2a0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  pSVar7 = (this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar7 != pSVar2) {
    do {
      (*(pSVar7->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2c0,pSVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
  }
  pAVar8 = (this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar3 = (this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pAVar8 != pAVar3) {
    do {
      (*(pAVar8->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2c0,pAVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pAVar8 = pAVar8 + 1;
    } while (pAVar8 != pAVar3);
  }
  pUVar9 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar4 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar9 != pUVar4) {
    do {
      (*(pUVar9->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2c0,pUVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pUVar9 = pUVar9 + 1;
    } while (pUVar9 != pUVar4);
  }
  pKVar5 = local_2a0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar5;
}

Assistant:

KString Underwater_Acoustic_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Underwater Acoustic PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:  " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator )    << "\n"
       << "Passive Parameter Index: " << GetEnumAsStringPassiveParameterIndex( m_ui16PassiveParamIndex )     << "\n"
       << "Prop Plant Config:       " << GetEnumAsStringPropulsionPlantConfiguration( m_ui8PropPlantConfig ) << "\n"
       << "Number Of Shafts:        " << ( KUINT16 )m_ui8NumShafts               << "\n"
       << "Number Of APA:           " << ( KUINT16 )m_ui8NumAPA                  << "\n"
       << "Number Of UAES:          " << ( KUINT16 )m_ui8NumEmitterSys           << "\n";

    vector<Shaft>::const_iterator citrShafts = m_vShafts.begin();
    vector<Shaft>::const_iterator citrShaftsEnd = m_vShafts.end();
    for( ; citrShafts != citrShaftsEnd; ++citrShafts )
    {
        ss << citrShafts->GetAsString();
    }

    vector<APA>::const_iterator citrAPA =  m_vAPA.begin();
    vector<APA>::const_iterator citrAPAEnd =  m_vAPA.end();
    for( ; citrAPA != citrAPAEnd; ++citrAPA )
    {
        ss << citrAPA->GetAsString();
    }

    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAES = m_vUAES.begin();
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAESEnd = m_vUAES.end();
    for( ; citrUAES != citrUAESEnd; ++citrUAES )
    {
        ss << citrUAES->GetAsString();
    }

    return ss.str();
}